

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CX<float>::CX(CX<float> *this,int control,int target,int controlState)

{
  PauliX<float> *pPVar1;
  
  QControlledGate2<float>::QControlledGate2
            (&this->super_QControlledGate2<float>,control,controlState);
  (this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0018bb68;
  pPVar1 = (PauliX<float> *)operator_new(0x10);
  (pPVar1->super_QGate1<float>).super_QObject<float> = (QObject<float>)&PTR_nbQubits_0018b980;
  (pPVar1->super_QGate1<float>).qubit_ = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/QGate1.hpp"
                  ,0x21,"qclab::qgates::QGate1<float>::QGate1(const int) [T = float]");
  }
  (pPVar1->super_QGate1<float>).super_QObject<float> = (QObject<float>)&PTR_nbQubits_0018bcf0;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliX<float>,_std::default_delete<qclab::qgates::PauliX<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliX<float>_*,_std::default_delete<qclab::qgates::PauliX<float>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliX<float>_*,_false>._M_head_impl = pPVar1;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/CX.hpp"
                  ,0x2c,"qclab::qgates::CX<float>::CX(const int, const int, const int) [T = float]")
    ;
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/CX.hpp"
                ,0x2b,"qclab::qgates::CX<float>::CX(const int, const int, const int) [T = float]");
}

Assistant:

CX( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliX< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }